

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parameter.cpp
# Opt level: O2

void CoreMLConverter::convertCaffeParameter(ConvertLayerParameters layerParameters)

{
  string *layerName;
  uint __line;
  int iVar1;
  Type *caffeLayer;
  Type *pTVar2;
  NeuralNetworkLayer *this;
  Type *__x;
  BlobShape *pBVar3;
  int64 iVar4;
  LoadConstantLayerParams *this_00;
  uint64 value;
  uint64 value_00;
  uint64 value_01;
  Type *pTVar5;
  WeightParams *pWVar6;
  ParameterParameter *pPVar7;
  BlobShape *pBVar8;
  char *__assertion;
  int __val;
  allocator local_151;
  string local_150;
  Type *local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  top;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  bottom;
  string local_d0;
  string local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  caffeLayer = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<caffe::LayerParameter>::TypeHandler>
                         (&((layerParameters.prototxt)->layer_).super_RepeatedPtrFieldBase,
                          *layerParameters.layerId);
  iVar1 = getLayerIndex(caffeLayer,layerParameters.mapCaffeLayerNamesToIndex);
  pTVar2 = google::protobuf::internal::RepeatedPtrFieldBase::
           Get<google::protobuf::RepeatedPtrField<caffe::LayerParameter>::TypeHandler>
                     (&((layerParameters.protoweights)->layer_).super_RepeatedPtrFieldBase,iVar1);
  this = google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::Add
                   (layerParameters.nnWrite);
  if ((caffeLayer->top_).super_RepeatedPtrFieldBase.current_size_ != 1) {
    std::__cxx11::string::string((string *)&local_150,"Must have 1 output",(allocator *)&local_128);
    errorInCaffeProto(&local_150,(caffeLayer->name_).ptr_,(caffeLayer->type_).ptr_);
    std::__cxx11::string::~string((string *)&local_150);
  }
  bottom.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  top.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bottom.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  bottom.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  top.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  top.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_130 = pTVar2;
  __x = google::protobuf::internal::RepeatedPtrFieldBase::
        Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                  (&(caffeLayer->top_).super_RepeatedPtrFieldBase,0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&top,__x);
  convertCaffeMetadata
            ((caffeLayer->name_).ptr_,&bottom,&top,layerParameters.nnWrite,
             layerParameters.mappingDataBlobNames);
  pPVar7 = caffeLayer->parameter_param_;
  if (pPVar7 == (ParameterParameter *)0x0) {
    pPVar7 = (ParameterParameter *)&caffe::_ParameterParameter_default_instance_;
  }
  if (((pPVar7->_has_bits_).has_bits_[0] & 1) == 0) {
    std::__cxx11::string::string
              ((string *)&local_150,"Must have \'shape\' set",(allocator *)&local_128);
    errorInCaffeProto(&local_150,(caffeLayer->name_).ptr_,(caffeLayer->type_).ptr_);
    std::__cxx11::string::~string((string *)&local_150);
  }
  pBVar8 = pPVar7->shape_;
  pBVar3 = pBVar8;
  if (pBVar8 == (BlobShape *)0x0) {
    pBVar3 = (BlobShape *)&caffe::_BlobShape_default_instance_;
  }
  if (1 < (pBVar3->dim_).current_size_ - 3U) {
    std::__cxx11::string::string
              ((string *)&local_150,"\'shape\' must be either 3 or 4 dimensions",
               (allocator *)&local_128);
    errorInCaffeProto(&local_150,(caffeLayer->name_).ptr_,(caffeLayer->type_).ptr_);
    std::__cxx11::string::~string((string *)&local_150);
    pBVar8 = pPVar7->shape_;
  }
  if (pBVar8 == (BlobShape *)0x0) {
    pBVar8 = (BlobShape *)&caffe::_BlobShape_default_instance_;
  }
  if ((pBVar8->dim_).current_size_ == 4) {
    iVar4 = caffe::BlobShape::dim(pBVar8,0);
    if (iVar4 != 1) {
      std::__cxx11::string::string
                ((string *)&local_150,"if \'shape\' is of 4 dimesnions, first one must be 1",
                 (allocator *)&local_128);
      errorInCaffeProto(&local_150,(caffeLayer->name_).ptr_,(caffeLayer->type_).ptr_);
      std::__cxx11::string::~string((string *)&local_150);
    }
  }
  if ((local_130->blobs_).super_RepeatedPtrFieldBase.current_size_ != 1) {
    std::__cxx11::string::string
              ((string *)&local_150,"Must have 1 weight blob",(allocator *)&local_128);
    errorInCaffeProto(&local_150,(caffeLayer->name_).ptr_,(caffeLayer->type_).ptr_);
    std::__cxx11::string::~string((string *)&local_150);
  }
  this_00 = CoreML::Specification::NeuralNetworkLayer::mutable_loadconstant(this);
  pBVar8 = pPVar7->shape_;
  if (pBVar8 == (BlobShape *)0x0) {
    pBVar8 = (BlobShape *)&caffe::_BlobShape_default_instance_;
  }
  iVar1 = (pBVar8->dim_).current_size_;
  value = caffe::BlobShape::dim(pBVar8,iVar1 + -3);
  pBVar8 = pPVar7->shape_;
  if (pBVar8 == (BlobShape *)0x0) {
    pBVar8 = (BlobShape *)&caffe::_BlobShape_default_instance_;
  }
  value_00 = caffe::BlobShape::dim(pBVar8,iVar1 + -2);
  pBVar8 = pPVar7->shape_;
  if (pBVar8 == (BlobShape *)0x0) {
    pBVar8 = (BlobShape *)&caffe::_BlobShape_default_instance_;
  }
  value_01 = caffe::BlobShape::dim(pBVar8,iVar1 + -1);
  pTVar2 = local_130;
  if ((long)value < 0) {
    __assertion = "c >= 0";
    __line = 0x3b;
  }
  else {
    CoreML::Specification::LoadConstantLayerParams::add_shape(this_00,value);
    if ((long)value_00 < 0) {
      __assertion = "h >= 0";
      __line = 0x3d;
    }
    else {
      CoreML::Specification::LoadConstantLayerParams::add_shape(this_00,value_00);
      if (-1 < (long)value_01) {
        CoreML::Specification::LoadConstantLayerParams::add_shape(this_00,value_01);
        pTVar5 = google::protobuf::internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<caffe::BlobProto>::TypeHandler>
                           (&(pTVar2->blobs_).super_RepeatedPtrFieldBase,0);
        __val = (int)value_01 * (int)value_00 * (int)value;
        iVar1 = (pTVar5->data_).current_size_;
        if (iVar1 != __val) {
          std::__cxx11::to_string(&local_90,__val);
          std::operator+(&local_70,"Expected blob size = ",&local_90);
          std::operator+(&local_50,&local_70," but found blob of size = ");
          std::__cxx11::to_string(&local_b0,iVar1);
          std::operator+(&local_128,&local_50,&local_b0);
          std::operator+(&local_150,&local_128," in caffe");
          layerName = (caffeLayer->name_).ptr_;
          std::__cxx11::string::string((string *)&local_d0,"Inner Product",&local_151);
          errorInCaffeProto(&local_150,layerName,&local_d0);
          std::__cxx11::string::~string((string *)&local_d0);
          std::__cxx11::string::~string((string *)&local_150);
          std::__cxx11::string::~string((string *)&local_128);
          std::__cxx11::string::~string((string *)&local_b0);
          std::__cxx11::string::~string((string *)&local_50);
          std::__cxx11::string::~string((string *)&local_70);
          std::__cxx11::string::~string((string *)&local_90);
        }
        pWVar6 = CoreML::Specification::LoadConstantLayerParams::mutable_data(this_00);
        local_150._M_dataplus._M_p._0_4_ = 0;
        google::protobuf::RepeatedField<float>::Resize
                  (&pWVar6->floatvalue_,__val,(float *)&local_150);
        pTVar5 = google::protobuf::internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<caffe::BlobProto>::TypeHandler>
                           (&(pTVar2->blobs_).super_RepeatedPtrFieldBase,0);
        google::protobuf::RepeatedField<float>::CopyFrom(&pWVar6->floatvalue_,&pTVar5->data_);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&top);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&bottom);
        return;
      }
      __assertion = "w >= 0";
      __line = 0x3f;
    }
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/caffeconverter/Caffe/Parameter.cpp"
                ,__line,
                "void CoreMLConverter::convertCaffeParameter(CoreMLConverter::ConvertLayerParameters)"
               );
}

Assistant:

void CoreMLConverter::convertCaffeParameter(CoreMLConverter::ConvertLayerParameters layerParameters) {
    
    int layerId = *layerParameters.layerId;
    const caffe::LayerParameter& caffeLayer = layerParameters.prototxt.layer(layerId);
    int layerIdWeights = CoreMLConverter::getLayerIndex(caffeLayer,layerParameters.mapCaffeLayerNamesToIndex);
    const caffe::LayerParameter& caffeLayerWeights = layerParameters.protoweights.layer(layerIdWeights);
    std::map<std::string, std::string>& mappingDataBlobNames = layerParameters.mappingDataBlobNames;
   
    //Write Layer metadata
    auto* nnWrite = layerParameters.nnWrite;
    Specification::NeuralNetworkLayer* specLayer = nnWrite->Add();
    if (caffeLayer.top_size() != 1) {
        CoreMLConverter::errorInCaffeProto("Must have 1 output",caffeLayer.name(),caffeLayer.type());
    }
    std::vector<std::string> bottom;
    std::vector<std::string> top;
    top.push_back(caffeLayer.top(0));
    CoreMLConverter::convertCaffeMetadata(caffeLayer.name(), 
                                         bottom, top,
                                         nnWrite, mappingDataBlobNames);
    
    const caffe::ParameterParameter& caffeLayerParams = caffeLayer.parameter_param();
    //***************** Some Error Checking in Caffe Proto **********
    if (!caffeLayerParams.has_shape()){
        CoreMLConverter::errorInCaffeProto("Must have 'shape' set", caffeLayer.name(), caffeLayer.type());
    }
    if (! (caffeLayerParams.shape().dim_size() == 3 || caffeLayerParams.shape().dim_size() == 4)){
        CoreMLConverter::errorInCaffeProto("'shape' must be either 3 or 4 dimensions",caffeLayer.name(), caffeLayer.type());
    }
    if (caffeLayerParams.shape().dim_size() == 4 && caffeLayerParams.shape().dim(0) != 1){
        CoreMLConverter::errorInCaffeProto("if 'shape' is of 4 dimesnions, first one must be 1",caffeLayer.name(), caffeLayer.type());
    }
    if (caffeLayerWeights.blobs_size() != 1){
        CoreMLConverter::errorInCaffeProto("Must have 1 weight blob",caffeLayer.name(), caffeLayer.type());
    }
    //***************************************************************
    Specification::LoadConstantLayerParams* specLayerParams = specLayer->mutable_loadconstant();
    int dim = caffeLayerParams.shape().dim_size();
    int64_t c = caffeLayerParams.shape().dim(dim-3);
    int64_t h = caffeLayerParams.shape().dim(dim-2);
    int64_t w = caffeLayerParams.shape().dim(dim-1);
    assert(c >= 0);
    specLayerParams->add_shape(static_cast<uint64_t>(c));
    assert(h >= 0);
    specLayerParams->add_shape(static_cast<uint64_t>(h));
    assert(w >= 0);
    specLayerParams->add_shape(static_cast<uint64_t>(w));

    int blobSize = static_cast<int> (c*h*w);
    int caffeBlobSize = caffeLayerWeights.blobs(0).data_size();
    if (caffeBlobSize != blobSize){
        CoreMLConverter::errorInCaffeProto("Expected blob size = "+std::to_string(blobSize)+" but found blob of size = "+
                        std::to_string(caffeBlobSize)+" in caffe", caffeLayer.name(), "Inner Product");
    }
    ::google::protobuf::RepeatedField<float>* dataWrite = specLayerParams->mutable_data()->mutable_floatvalue();
    dataWrite->Resize(blobSize, 0.0);
    dataWrite->CopyFrom(caffeLayerWeights.blobs(0).data());
}